

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGig.c
# Opt level: O2

Gia_Man_t * Gls_ManConstruct(Gls_Man_t *p,char *pFileName)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int Entry;
  uint i;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Gia_Man_t *p_02;
  char *pcVar4;
  Vec_Int_t *p_03;
  Vec_Int_t *pVVar5;
  int *piVar6;
  int iVar7;
  long lVar8;
  long lStack_60;
  word Truth;
  
  iVar7 = 0;
  p_00 = Vec_IntAlloc(0);
  p_01 = Vec_IntAlloc(6);
  p_02 = Gia_ManStart(p->vTypes->nSize);
  pcVar4 = Abc_UtilStrsav(pFileName);
  p_02->pName = pcVar4;
  pcVar4 = Abc_UtilStrsav(pFileName);
  p_02->pSpec = pcVar4;
  iVar2 = p->vTypes->nSize;
  p_03 = Vec_IntAlloc(iVar2);
  p_03->nSize = iVar2;
  if (p_03->pArray != (int *)0x0) {
    memset(p_03->pArray,0xff,(long)iVar2 << 2);
  }
  Vec_IntWriteEntry(p_03,0,0);
  Vec_IntWriteEntry(p_03,1,1);
  while( true ) {
    if (p->vOrderPis->nSize <= iVar7) break;
    iVar2 = Vec_IntEntry(p->vOrderPis,iVar7);
    iVar3 = Gia_ManAppendCi(p_02);
    Vec_IntWriteEntry(p_03,iVar2,iVar3);
    iVar7 = iVar7 + 1;
  }
  for (iVar2 = 0; iVar2 < p->vOrderBoxes->nSize; iVar2 = iVar2 + 1) {
    iVar7 = Vec_IntEntry(p->vOrderBoxes,iVar2);
    iVar3 = Gia_ManAppendCi(p_02);
    Vec_IntWriteEntry(p_03,iVar7,iVar3);
  }
  for (iVar2 = 0; iVar2 < p->vOrderDelays->nSize; iVar2 = iVar2 + 1) {
    iVar7 = Vec_IntEntry(p->vOrderDelays,iVar2);
    iVar3 = Vec_IntEntry(p->vIndexes,iVar7);
    if (iVar2 != iVar3) {
      __assert_fail("Index == Vec_IntEntry(p->vIndexes, iObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaGig.c"
                    ,0x195,"Gia_Man_t *Gls_ManConstruct(Gls_Man_t *, char *)");
    }
    pVVar5 = Vec_WecEntry(p->vDelayOuts,iVar2);
    iVar3 = pVVar5->nSize;
    if (iVar3 == 0) {
      iVar3 = Gia_ManAppendCi(p_02);
      Vec_IntWriteEntry(p_03,iVar7,iVar3);
    }
    else {
      for (iVar7 = 0; iVar7 < iVar3; iVar7 = iVar7 + 1) {
        iVar3 = Vec_IntEntry(pVVar5,iVar7);
        Entry = Gia_ManAppendCi(p_02);
        Vec_IntWriteEntry(p_03,iVar3,Entry);
        iVar3 = pVVar5->nSize;
      }
    }
  }
  iVar2 = 0;
  do {
    if (p->vOrderLuts->nSize <= iVar2) {
      iVar2 = 0;
      while( true ) {
        if (p->vOrderDelays->nSize <= iVar2) {
          for (iVar2 = 0; iVar2 < p->vOrderPos->nSize; iVar2 = iVar2 + 1) {
            iVar7 = Vec_IntEntry(p->vOrderPos,iVar2);
            iVar7 = Vec_IntEntry(p->vIndexes,iVar7);
            iVar7 = Vec_IntEntry(p_03,iVar7);
            Gia_ManAppendCo(p_02,iVar7);
          }
          for (iVar2 = 0; iVar2 < p->vOrderSeqs->nSize; iVar2 = iVar2 + 1) {
            iVar7 = Vec_IntEntry(p->vOrderSeqs,iVar2);
            iVar7 = Vec_IntEntry(p->vIndexes,iVar7);
            iVar7 = Vec_IntEntry(p_03,iVar7);
            Gia_ManAppendCo(p_02,iVar7);
          }
          Vec_IntFree(p_03);
          Vec_IntFree(p_00);
          Vec_IntFree(p_01);
          return p_02;
        }
        Vec_IntEntry(p->vOrderDelays,iVar2);
        pVVar5 = Vec_WecEntry(p->vDelayIns,iVar2);
        iVar7 = pVVar5->nSize;
        if (iVar7 < 1) break;
        for (iVar3 = 0; iVar3 < iVar7; iVar3 = iVar3 + 1) {
          iVar7 = Vec_IntEntry(pVVar5,iVar3);
          iVar7 = Vec_IntEntry(p_03,iVar7);
          Gia_ManAppendCo(p_02,iVar7);
          iVar7 = pVVar5->nSize;
        }
        iVar2 = iVar2 + 1;
      }
      __assert_fail("Vec_IntSize(vArray) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaGig.c"
                    ,0x1b7,"Gia_Man_t *Gls_ManConstruct(Gls_Man_t *, char *)");
    }
    iVar7 = Vec_IntEntry(p->vOrderLuts,iVar2);
    bVar1 = Vec_StrEntry(p->vTypes,iVar7);
    if ((byte)(bVar1 - 7) < 2) {
      i = Vec_IntEntry(p->vIndexes,iVar7);
      if (bVar1 == 7) {
        piVar6 = Vec_IntEntryP(p->vLut4s,i << 2);
        iVar3 = Vec_IntEntry(p->vLut4TTs,i);
        Truth = (word)iVar3;
        lStack_60 = 4;
      }
      else {
        piVar6 = Vec_IntEntryP(p->vLut6s,i * 6);
        if (((int)i < 0) || (p->vLut6TTs->nSize <= (int)i)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                        ,0x1ad,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
        }
        Truth = p->vLut6TTs->pArray[i];
        lStack_60 = 6;
      }
      p_01->nSize = 0;
      for (lVar8 = 0; lStack_60 != lVar8; lVar8 = lVar8 + 1) {
        if (piVar6[lVar8] == -1) {
          iVar3 = 0;
        }
        else {
          iVar3 = Vec_IntEntry(p_03,piVar6[lVar8]);
        }
        Vec_IntPush(p_01,iVar3);
      }
      iVar3 = Kit_TruthToGia(p_02,(uint *)&Truth,p_01->nSize,p_00,p_01,0);
      Vec_IntWriteEntry(p_03,iVar7,iVar3);
    }
    else if ((bVar1 & 0xfd) == 4) {
      iVar3 = Vec_IntEntry(p->vIndexes,iVar7);
      iVar3 = Vec_IntEntry(p_03,iVar3);
      Vec_IntWriteEntry(p_03,iVar7,iVar3);
    }
    iVar2 = iVar2 + 1;
  } while( true );
}

Assistant:

Gia_Man_t * Gls_ManConstruct( Gls_Man_t * p, char * pFileName )
{
    extern int Kit_TruthToGia( Gia_Man_t * pMan, unsigned * pTruth, int nVars, Vec_Int_t * vMemory, Vec_Int_t * vLeaves, int fHash );
    Gia_Man_t * pGia = NULL;  
    Vec_Int_t * vMap, * vArray;
    Vec_Int_t * vCover = Vec_IntAlloc(0);
    Vec_Int_t * vLeaves = Vec_IntAlloc(6);
    int  k, iObj, iLit, Index;  char Type;
    // create new manager
    pGia = Gia_ManStart( Vec_StrSize(p->vTypes) );
    pGia->pName = Abc_UtilStrsav( pFileName );
    pGia->pSpec = Abc_UtilStrsav( pFileName );
    // create constants
    vMap = Vec_IntStartFull( Vec_StrSize(p->vTypes) );
    Vec_IntWriteEntry( vMap, 0, 0 );
    Vec_IntWriteEntry( vMap, 1, 1 );
    // create primary inputs
    Vec_IntForEachEntry( p->vOrderPis, iObj, k )
        Vec_IntWriteEntry( vMap, iObj, Gia_ManAppendCi(pGia) );
    // create box outputs
    Vec_IntForEachEntry( p->vOrderBoxes, iObj, k )
        Vec_IntWriteEntry( vMap, iObj, Gia_ManAppendCi(pGia) );
    // create delay outputs
    Vec_IntForEachEntry( p->vOrderDelays, iObj, Index )
    {
        assert( Index == Vec_IntEntry(p->vIndexes, iObj) );
        vArray = Vec_WecEntry(p->vDelayOuts, Index);
        if ( Vec_IntSize(vArray) == 0 )
            Vec_IntWriteEntry( vMap, iObj, Gia_ManAppendCi(pGia) );
        else
            Vec_IntForEachEntry( vArray, iObj, k )
                Vec_IntWriteEntry( vMap, iObj, Gia_ManAppendCi(pGia) );
    }
    // construct LUTs
    Vec_IntForEachEntry( p->vOrderLuts, iObj, Index )
    {
        Type = Vec_StrEntry( p->vTypes, iObj );
        if ( Type == GLS_LUT4 || Type == GLS_LUT6 )
        {
            int Limit = Type == GLS_LUT4 ? 4 : 6;
            int Index = Vec_IntEntry(p->vIndexes, iObj);
            int * pFanins = Type == GLS_LUT4 ? Vec_IntEntryP(p->vLut4s, 4*Index) : Vec_IntEntryP(p->vLut6s, 6*Index);
            word Truth = Type == GLS_LUT4 ? (word)Vec_IntEntry(p->vLut4TTs, Index) : Vec_WrdEntry(p->vLut6TTs, Index);
            Vec_IntClear( vLeaves );
            for ( k = 0; k < Limit; k++ )
                Vec_IntPush( vLeaves, pFanins[k] == GLS_NONE ? 0 : Vec_IntEntry(vMap, pFanins[k]) );
            iLit = Kit_TruthToGia( pGia, (unsigned *)&Truth, Vec_IntSize(vLeaves), vCover, vLeaves, 0 );
            Vec_IntWriteEntry( vMap, iObj, iLit );
        }
        else if ( Type == GLS_BAR || Type == GLS_SEL )
        {
            iLit = Vec_IntEntry( vMap, Vec_IntEntry(p->vIndexes, iObj) );
            Vec_IntWriteEntry( vMap, iObj, iLit );
        }
    }
    // delay inputs
    Vec_IntForEachEntry( p->vOrderDelays, iObj, Index )
    {
        vArray = Vec_WecEntry(p->vDelayIns, Index);
        assert( Vec_IntSize(vArray) > 0 );
        Vec_IntForEachEntry( vArray, iObj, k )
            Gia_ManAppendCo( pGia, Vec_IntEntry(vMap, iObj) );
    }
    // create primary outputs
    Vec_IntForEachEntry( p->vOrderPos, iObj, k )
        Gia_ManAppendCo( pGia, Vec_IntEntry(vMap, Vec_IntEntry(p->vIndexes, iObj)) );
    // create sequential nodes
    Vec_IntForEachEntry( p->vOrderSeqs, iObj, k )
        Gia_ManAppendCo( pGia, Vec_IntEntry(vMap, Vec_IntEntry(p->vIndexes, iObj)) );
    Vec_IntFree( vMap );
    Vec_IntFree( vCover );
    Vec_IntFree( vLeaves );
    // print delay boxes
//    for ( k = 0; k < Vec_IntSize(p->vDelays); k++ )
//        printf( "%d:%d  ", Vec_IntSize(Vec_WecEntry(p->vDelayIns, k)), Vec_IntSize(Vec_WecEntry(p->vDelayOuts, k)) );
//    printf( "\n" );
    return pGia;
}